

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPResponse.cpp
# Opt level: O0

bool __thiscall SNMPResponse::addErrorResponse(SNMPResponse *this,VarBind *response)

{
  size_type sVar1;
  int index;
  VarBind *response_local;
  SNMPResponse *this_local;
  
  sVar1 = std::deque<VarBind,_std::allocator<VarBind>_>::size(&(this->super_SNMPPacket).varbindList)
  ;
  std::deque<VarBind,std::allocator<VarBind>>::emplace_back<VarBind_const&>
            ((deque<VarBind,std::allocator<VarBind>> *)&(this->super_SNMPPacket).varbindList,
             response);
  if (response->errorStatus != NO_ERROR) {
    (this->super_SNMPPacket).errorStatus = (ErrorStatus)response->errorStatus;
    (this->super_SNMPPacket).errorIndex.errorIndex = (int)sVar1 + 1;
  }
  return true;
}

Assistant:

bool SNMPResponse::addErrorResponse(const VarBind& response){
    int index = this->varbindList.size() + 1;
    this->varbindList.emplace_back(response);
    
    if(response.errorStatus != NO_ERROR){
        this->errorStatus.errorStatus = response.errorStatus;
        this->errorIndex.errorIndex = index;
    }
    return true;
}